

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O3

bool IsChildWithParentsTree(Package *package)

{
  element_type *peVar1;
  pointer pCVar2;
  bool bVar3;
  long lVar4;
  const_iterator cVar5;
  pointer psVar6;
  CTxIn *input_4;
  __hashtable *__h;
  const_iterator __end0;
  const_iterator __end0_4;
  long lVar7;
  pointer psVar8;
  CTxIn *input;
  pointer pCVar9;
  pointer psVar10;
  long in_FS_OFFSET;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  parent_txids;
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_a8;
  undefined1 *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = IsChildWithParents(package);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_00286380;
  }
  SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&_Stack_a8);
  _Stack_a8._M_buckets = &_Stack_a8._M_single_bucket;
  _Stack_a8._M_bucket_count = 1;
  _Stack_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_a8._M_element_count = 0;
  _Stack_a8._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_a8._M_rehash_policy._M_next_resize = 0;
  _Stack_a8._M_single_bucket = (__node_base_ptr)0x0;
  psVar8 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar10 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar10 + -1) {
    do {
      peVar1 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58 = *(undefined4 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uStack_54 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
      uStack_50 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uStack_4c = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
      local_48 = *(undefined4 *)
                  ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uStack_44 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14);
      uStack_40 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uStack_3c = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c);
      local_60 = (undefined1 *)&_Stack_a8;
      std::
      _Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<uint256_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uint256,true>>>>
                ((_Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&_Stack_a8,&local_58,&local_60);
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar10 + -1);
    psVar8 = (package->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar10 = (package->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  psVar10 = psVar10 + -1;
  lVar4 = (long)psVar10 - (long)psVar8;
  lVar7 = lVar4 >> 6;
  if (0 < lVar7) {
    do {
      peVar1 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar9 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
        cVar5 = std::
                _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&_Stack_a8,(key_type *)pCVar9);
        psVar6 = psVar8;
        if (cVar5.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0)
        goto LAB_00286372;
      }
      peVar1 = psVar8[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar9 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
        cVar5 = std::
                _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&_Stack_a8,(key_type *)pCVar9);
        if (cVar5.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0) {
          psVar6 = psVar8 + 1;
          goto LAB_00286372;
        }
      }
      peVar1 = psVar8[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar9 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
        cVar5 = std::
                _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&_Stack_a8,(key_type *)pCVar9);
        if (cVar5.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0) {
          psVar6 = psVar8 + 2;
          goto LAB_00286372;
        }
      }
      peVar1 = psVar8[3].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar9 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
        cVar5 = std::
                _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&_Stack_a8,(key_type *)pCVar9);
        if (cVar5.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0) {
          psVar6 = psVar8 + 3;
          goto LAB_00286372;
        }
      }
      psVar8 = psVar8 + 4;
      bVar3 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar3);
    lVar4 = (long)psVar10 - (long)psVar8;
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 == 1) {
LAB_00286327:
    peVar1 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar9 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while ((psVar6 = psVar10, pCVar9 != pCVar2 &&
           (cVar5 = std::
                    _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&_Stack_a8,(key_type *)pCVar9), psVar6 = psVar8,
           cVar5.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0))) {
      pCVar9 = pCVar9 + 1;
    }
  }
  else {
    if (lVar4 == 2) {
LAB_002862f7:
      peVar1 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar9 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
        cVar5 = std::
                _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&_Stack_a8,(key_type *)pCVar9);
        psVar6 = psVar8;
        if (cVar5.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0)
        goto LAB_00286372;
      }
      psVar8 = psVar8 + 1;
      goto LAB_00286327;
    }
    psVar6 = psVar10;
    if (lVar4 == 3) {
      peVar1 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar9 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
        cVar5 = std::
                _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&_Stack_a8,(key_type *)pCVar9);
        psVar6 = psVar8;
        if (cVar5.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0)
        goto LAB_00286372;
      }
      psVar8 = psVar8 + 1;
      goto LAB_002862f7;
    }
  }
LAB_00286372:
  bVar3 = psVar6 == psVar10;
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&_Stack_a8);
LAB_00286380:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool IsChildWithParentsTree(const Package& package)
{
    if (!IsChildWithParents(package)) return false;
    std::unordered_set<uint256, SaltedTxidHasher> parent_txids;
    std::transform(package.cbegin(), package.cend() - 1, std::inserter(parent_txids, parent_txids.end()),
                   [](const auto& ptx) { return ptx->GetHash(); });
    // Each parent must not have an input who is one of the other parents.
    return std::all_of(package.cbegin(), package.cend() - 1, [&](const auto& ptx) {
        for (const auto& input : ptx->vin) {
            if (parent_txids.count(input.prevout.hash) > 0) return false;
        }
        return true;
    });
}